

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *expected;
  pointer *bindings;
  undefined1 auVar1 [8];
  size_t sVar2;
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  long lVar6;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  undefined1 local_120 [8];
  Location local_118;
  _Head_base<0UL,_wabt::FuncImport_*,_false> local_f8;
  _Head_base<0UL,_wabt::FuncImport_*,_false> local_f0;
  string name;
  ModuleFieldList export_fields;
  TypeVector local_types;
  undefined8 uStack_90;
  string local_88 [32];
  string local_68 [32];
  Location loc;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar4 = Expect(this,First_RefKind);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  RVar4 = ParseInlineExports(this,&export_fields,First);
  EVar5 = Error;
  if (RVar4.enum_ == Error) goto LAB_00134fa7;
  bVar3 = PeekMatchLpar(this,Import);
  if (bVar3) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::FuncImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    auVar1 = local_120;
    RVar4 = ParseInlineImport(this,(Import *)local_120);
    if (((RVar4.enum_ != Error) &&
        (RVar4 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)auVar1 + 0x70)),
        RVar4.enum_ != Error)) &&
       (RVar4 = ParseFuncSignature(this,(FuncSignature *)((long)auVar1 + 0xc0),
                                   (BindingHash *)((long)auVar1 + 0x178)), RVar4.enum_ != Error)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_types,"type",&local_121);
      std::__cxx11::string::string<std::allocator<char>>(local_88,"param",&local_122);
      std::__cxx11::string::string<std::allocator<char>>(local_68,"result",&local_123);
      expected = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (local_120 + 8);
      local_118.filename._M_len = 0;
      local_118.filename._M_str = (char *)0x0;
      local_118.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>(expected,(string *)&local_types,&loc);
      RVar4 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)expected,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)expected);
      lVar6 = 0x40;
      do {
        std::__cxx11::string::_M_dispose();
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x20);
      if (RVar4.enum_ != Error) {
        GetLocation((Location *)&local_types,this);
        std::
        make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
                  ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)
                   (local_120 + 8),(Location *)local_120);
        local_f0._M_head_impl = (FuncImport *)local_118.filename._M_len;
        local_118.filename._M_len = 0;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_f0);
        if (local_f0._M_head_impl != (FuncImport *)0x0) {
          (*((local_f0._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
            _vptr_Import[1])();
        }
        local_f0._M_head_impl = (FuncImport *)0x0;
        if ((FuncImport *)local_118.filename._M_len != (FuncImport *)0x0) {
          (*(((ImportMixin<(wabt::ExternalKind)0> *)local_118.filename._M_len)->super_Import).
            _vptr_Import[1])();
        }
LAB_00135080:
        if (local_120 != (undefined1  [8])0x0) {
          (*(((FuncImport *)local_120)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
            _vptr_Import[1])();
        }
        anon_unknown_1::AppendInlineExportFields
                  (module,&export_fields,
                   (int)((ulong)((long)(module->funcs).
                                       super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->funcs).
                                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar4 = Expect(this,Rpar);
        EVar5 = (Enum)(RVar4.enum_ == Error);
        goto LAB_00134fa7;
      }
    }
  }
  else {
    std::make_unique<wabt::FuncModuleField,wabt::Location&,std::__cxx11::string&>
              ((Location *)(local_120 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
    sVar2 = local_118.filename._M_len;
    GetLocation((Location *)&local_types,this);
    (((Func *)(sVar2 + 0x50))->loc).filename._M_len =
         (size_t)local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (((Func *)(sVar2 + 0x50))->loc).filename._M_str = (char *)uStack_90;
    (((Func *)(sVar2 + 0x50))->exprs).last_ =
         (Expr *)local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
    (((Func *)(sVar2 + 0x50))->exprs).size_ =
         (size_t)local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    RVar4 = ParseTypeUseOpt(this,(FuncDeclaration *)&(((Func *)(sVar2 + 0x50))->name).field_2);
    local_120 = (undefined1  [8])local_118.filename._M_len;
    if (RVar4.enum_ != Error) {
      bindings = &(((Func *)(sVar2 + 0x50))->local_types).decls_.
                  super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      RVar4 = ParseFuncSignature(this,(FuncSignature *)
                                      ((long)&(((Func *)(sVar2 + 0x50))->decl).type_var.field_2 +
                                      0x10),(BindingHash *)bindings);
      local_120 = (undefined1  [8])local_118.filename._M_len;
      if (RVar4.enum_ != Error) {
        local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        RVar4 = ParseBoundValueTypeList
                          (this,Local,&local_types,(BindingHash *)bindings,
                           (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&(((Func *)(sVar2 + 0x50))->decl).sig.result_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish,
                           (Index)((ulong)(*(long *)((long)&(((Func *)(sVar2 + 0x50))->decl).
                                                            type_var.field_2 + 0x18) -
                                          *(long *)((long)&(((Func *)(sVar2 + 0x50))->decl).type_var
                                                           .field_2 + 0x10)) >> 3));
        if (RVar4.enum_ != Error) {
          LocalTypes::Set((LocalTypes *)
                          &(((Func *)(sVar2 + 0x50))->decl).sig.result_type_names._M_h.
                           _M_rehash_policy._M_next_resize,&local_types);
          RVar4 = ParseTerminatingInstrList
                            (this,(ExprList *)
                                  &(((Func *)(sVar2 + 0x50))->bindings).
                                   super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                                   ._M_h._M_rehash_policy._M_next_resize);
          if (RVar4.enum_ != Error) {
            local_f8._M_head_impl = (FuncImport *)local_118.filename._M_len;
            local_118.filename._M_len = 0;
            Module::AppendField(module,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                                        *)&local_f8);
            if (local_f8._M_head_impl != (FuncImport *)0x0) {
              (*((local_f8._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
                _vptr_Import[1])();
            }
            local_f8._M_head_impl = (FuncImport *)0x0;
            std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                      (&local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
            local_120 = (undefined1  [8])local_118.filename._M_len;
            goto LAB_00135080;
          }
        }
        std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                  (&local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
        local_120 = (undefined1  [8])local_118.filename._M_len;
      }
    }
  }
  if (local_120 != (undefined1  [8])0x0) {
    (*(((FuncImport *)local_120)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
      _vptr_Import[1])();
  }
LAB_00134fa7:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<FuncModuleField>(loc, name);
    Func& func = field->func;
    func.loc = GetLocation();
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    TypeVector local_types;
    CHECK_RESULT(ParseBoundValueTypeList(
        TokenType::Local, &local_types, &func.bindings,
        &func.decl.sig.param_type_names, func.GetNumParams()));
    func.local_types.Set(local_types);
    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}